

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O1

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::anon_unknown_3::Vars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  FieldDescriptor FVar1;
  Options *options;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  string lazy_var;
  string trivial_default;
  allocator_type local_ba9;
  undefined1 local_ba8 [48];
  undefined1 local_b78 [32];
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  undefined1 local_a58 [32];
  char *local_a38;
  undefined1 local_a30 [32];
  undefined1 local_a10 [32];
  undefined1 local_9f0 [32];
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  undefined1 local_950 [32];
  string local_930;
  string local_910;
  unsigned_long local_8e0;
  Sub local_8d8;
  undefined1 local_820 [48];
  _Alloc_hider local_7f0;
  char *local_7e8;
  byte abStack_7d8 [8];
  long alStack_7d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  undefined1 auStack_7a8 [32];
  undefined1 *local_788;
  char acStack_768 [8];
  Sub local_760;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_760.key_._M_dataplus._M_p = (pointer)0x2;
  local_760.key_._M_string_length = 0x3fe587;
  bVar4 = opts->opensource_runtime != false;
  local_8d8.key_._M_dataplus._M_p = (pointer)0x6;
  if (bVar4) {
    local_8d8.key_._M_dataplus._M_p = (pointer)0x10;
  }
  local_8d8.key_._M_string_length = 0x37dd6e;
  if (bVar4) {
    local_8d8.key_._M_string_length = 0x37dd75;
  }
  options = (Options *)local_820;
  local_820._0_8_ = &DAT_00000029;
  local_820._8_8_ = "::internal::GetEmptyStringAlreadyInited()";
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)local_a58,(AlphaNum *)&local_760,(AlphaNum *)&local_8d8);
  QualifiedClassName_abi_cxx11_(&local_910,*(cpp **)(field + 0x20),(Descriptor *)opts,options);
  local_760.key_._M_dataplus._M_p = (pointer)local_910._M_string_length;
  local_760.key_._M_string_length = (size_type)local_910._M_dataplus._M_p;
  local_8d8.key_._M_dataplus._M_p = (pointer)0x2;
  local_8d8.key_._M_string_length = 0x3fe587;
  MakeDefaultFieldName_abi_cxx11_((string *)local_ba8,(cpp *)field,field_01);
  field_00 = (FieldDescriptor *)local_820;
  local_820._0_8_ = local_ba8._8_8_;
  local_820._8_8_ = local_ba8._0_8_;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)local_b78,(AlphaNum *)&local_760,(AlphaNum *)&local_8d8);
  if ((SplitMap *)local_ba8._0_8_ != (SplitMap *)(local_ba8 + 0x10)) {
    operator_delete((void *)local_ba8._0_8_,local_ba8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  lVar3 = *(long *)(*(long *)(field + 0x50) + 8);
  FVar1 = field[2];
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"kDefault","");
  DefaultValue_abi_cxx11_(&local_930,(cpp *)opts,(Options *)field,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_760,&local_a78,&local_930);
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a98,"kDefaultLen","");
  local_8e0 = *(unsigned_long *)(*(long *)(field + 0x50) + 8);
  io::Printer::Sub::Sub<unsigned_long>(&local_6a8,&local_a98,&local_8e0);
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"default_variable_name","");
  local_8d8.key_._M_dataplus._M_p = (pointer)0x2e;
  local_8d8.key_._M_string_length = 0x37f3e2;
  FieldName_abi_cxx11_((string *)local_ba8,(cpp *)field,field_02);
  local_820._0_8_ = local_ba8._8_8_;
  local_820._8_8_ = local_ba8._0_8_;
  local_910._M_dataplus._M_p = (pointer)0x1;
  local_910._M_string_length = 0x475d95;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)local_950,(AlphaNum *)&local_8d8,(AlphaNum *)local_820);
  if ((SplitMap *)local_ba8._0_8_ != (SplitMap *)(local_ba8 + 0x10)) {
    operator_delete((void *)local_ba8._0_8_,local_ba8._16_8_ + 1);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_5f0,&local_ab8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_950);
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad8,"default_variable_field","");
  MakeDefaultFieldName_abi_cxx11_(&local_970,(cpp *)field,field_03);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_538,&local_ad8,&local_970);
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"kDefaultStr","");
  if (lVar3 == 0) {
    local_9f0._0_8_ = local_9f0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_9f0,local_a58._0_8_,(char *)(local_a58._8_8_ + local_a58._0_8_));
  }
  else {
    local_820._0_8_ = local_b78._8_8_;
    local_820._8_8_ = local_b78._0_8_;
    local_910._M_dataplus._M_p = (pointer)0x6;
    local_910._M_string_length = 0x344647;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_9f0,(AlphaNum *)local_820);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_480,&local_af8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f0);
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"kDefaultValue","");
  if (lVar3 == 0) {
    local_ba8._0_8_ = (SplitMap *)0x1;
    local_ba8._8_8_ = "&";
    auStack_7a8._24_8_ = local_a58._8_8_;
    local_788 = (undefined1 *)local_a58._0_8_;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a10,(AlphaNum *)local_ba8);
  }
  else {
    local_a10._0_8_ = local_a10 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"nullptr","");
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_3c8,&local_b18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10);
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"lazy_var","");
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_310,&local_b38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b78);
  local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"lazy_args","");
  if (lVar3 == 0) {
    local_a30._0_8_ = local_a30 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"");
  }
  else {
    local_7c0._M_allocated_capacity = local_b78._8_8_;
    local_7c0._8_8_ = local_b78._0_8_;
    local_7f0._M_p = (pointer)0x1;
    local_7e8 = ",";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a30,(AlphaNum *)&local_7c0);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_8d8,&local_b58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a30);
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,",","");
  io::Printer::Sub::WithSuffix(&local_258,&local_8d8,&local_990);
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"byte","");
  pcVar2 = "char";
  if (FVar1 == (FieldDescriptor)0xc) {
    pcVar2 = "void";
  }
  io::Printer::Sub::Sub<char_const(&)[5]>(&local_1a0,&local_9b0,(char (*) [5])pcVar2);
  pcVar2 = "Set";
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"Set","");
  if (FVar1 == (FieldDescriptor)0xc) {
    pcVar2 = "SetBytes";
  }
  local_a38 = pcVar2;
  io::Printer::Sub::Sub<char_const*>(&local_e8,&local_9d0,&local_a38);
  __l._M_len = 10;
  __l._M_array = &local_760;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_ba9);
  lVar3 = 0x730;
  do {
    if (acStack_768[lVar3] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_7a8 + lVar3));
    }
    if ((long *)(local_7c0._M_local_buf + lVar3) != *(long **)((long)alStack_7d0 + lVar3)) {
      operator_delete(*(long **)((long)alStack_7d0 + lVar3),
                      *(long *)(local_7c0._M_local_buf + lVar3) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[abStack_7d8[lVar3]]._M_data)
              ((anon_class_1_0_00000001 *)&local_ba9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_820 + lVar3 + 0x28));
    abStack_7d8[lVar3] = 0xff;
    if ((long *)(local_820 + lVar3 + 0x18) != *(long **)(local_820 + lVar3 + 8)) {
      operator_delete(*(long **)(local_820 + lVar3 + 8),*(long *)(local_820 + lVar3 + 0x18) + 1);
    }
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if (local_8d8.annotation_.
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &local_8d8.annotation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8.value_.consume_after._M_dataplus._M_p != &local_8d8.value_.consume_after.field_2)
  {
    operator_delete(local_8d8.value_.consume_after._M_dataplus._M_p,
                    local_8d8.value_.consume_after.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_8d8.value_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)((anon_class_1_0_00000001 *)&local_a38,&local_8d8.value_.value);
  local_8d8.value_.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8.key_._M_dataplus._M_p != &local_8d8.key_.field_2) {
    operator_delete(local_8d8.key_._M_dataplus._M_p,local_8d8.key_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((undefined1 *)local_a30._0_8_ != local_a30 + 0x10) {
    operator_delete((void *)local_a30._0_8_,local_a30._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
    operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a10._0_8_ != local_a10 + 0x10) {
    operator_delete((void *)local_a10._0_8_,local_a10._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_9f0._0_8_ != local_9f0 + 0x10) {
    operator_delete((void *)local_9f0._0_8_,local_9f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_950._0_8_ != local_950 + 0x10) {
    operator_delete((void *)local_950._0_8_,local_950._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
  }
  if ((SplitMap *)local_b78._0_8_ != (SplitMap *)(local_b78 + 0x10)) {
    operator_delete((void *)local_b78._0_8_,local_b78._16_8_ + 1);
  }
  if ((undefined1 *)local_a58._0_8_ != local_a58 + 0x10) {
    operator_delete((void *)local_a58._0_8_,local_a58._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> Vars(const FieldDescriptor* field, const Options& options) {
  bool cold = ShouldSplit(field, options);
  return {
      {"Type", PrimitiveTypeName(options, field->cpp_type())},
      {"kDefault", DefaultValue(options, field)},
      {"_field_cached_byte_size_", MakeVarintCachedSizeFieldName(field, cold)},
  };
}